

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_8x4(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  int16_t *input_00;
  int16_t *input_01;
  
  input_00 = input + 4;
  input_01 = input;
  if (fliplr != 0) {
    input_01 = input_00;
    input_00 = input;
  }
  load_buffer_4x4(input_01,out,stride,flipud,fliplr,shift);
  load_buffer_4x4(input_00,out + 4,stride,flipud,fliplr,shift);
  return;
}

Assistant:

static inline void load_buffer_8x4(const int16_t *input, __m128i *out,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  const int16_t *topL = input;
  const int16_t *topR = input + 4;

  const int16_t *tmp;

  if (fliplr) {
    tmp = topL;
    topL = topR;
    topR = tmp;
  }

  load_buffer_4x4(topL, out, stride, flipud, fliplr, shift);
  load_buffer_4x4(topR, out + 4, stride, flipud, fliplr, shift);
}